

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  undefined1 local_50 [8];
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char **argv_local;
  int argc_local;
  
  get_args_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&str.field_2 + 8),argc,argv);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&str.field_2 + 8));
  if (sVar2 == 2) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&str.field_2 + 8),1);
    std::__cxx11::string::string((string *)local_50,(string *)pvVar3);
    bVar1 = unique((string *)local_50);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_50);
      std::operator<<(poVar4," has no repeated characters\n");
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_50);
      std::operator<<(poVar4," has repeated characters\n");
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&str.field_2 + 8));
  return 0;
}

Assistant:

int main(int argc, char** argv){
  auto args {get_args(argc, argv)};

  if (args.size() == 2){
    std::string str {args[1]};

    if (unique(str)){
      std::cout << str << " has no repeated characters\n";
    }
    else{
      std::cout << str << " has repeated characters\n";
    }
  }

  return 0;
}